

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
* __thiscall
Lib::
iterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>>
          (IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
           *__return_storage_ptr__,Lib *this,
          CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>
          *i)

{
  CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>
  CStack_28;
  
  CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>
  ::CatIterator(&CStack_28,
                (CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>
                 *)this);
  CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>
  ::CatIterator(&__return_storage_ptr__->_iter,&CStack_28);
  CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>
  ::~CatIterator((CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>
                  *)&CStack_28);
  return __return_storage_ptr__;
}

Assistant:

IterTraits<Iter> iterTraits(Iter i) { return IterTraits<Iter>(std::move(i)); }